

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

void __thiscall
AssemblyCode::CJumpLessCommand::CJumpLessCommand
          (CJumpLessCommand *this,CTemp *leftOperand,CTemp *rightOperand,string *label)

{
  pointer pcVar1;
  
  (this->super_AbstractJumpCommand).super_AssemblyCommand._vptr_AssemblyCommand =
       (_func_int **)&PTR___cxa_pure_virtual_00182860;
  (this->super_AbstractJumpCommand).label._M_dataplus._M_p =
       (pointer)&(this->super_AbstractJumpCommand).label.field_2;
  pcVar1 = (label->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_AbstractJumpCommand).label,pcVar1,
             pcVar1 + label->_M_string_length);
  (this->super_AbstractJumpCommand).super_AssemblyCommand._vptr_AssemblyCommand =
       (_func_int **)&PTR_GetIn_00182e48;
  (this->leftOperand).name._M_dataplus._M_p = (pointer)&(this->leftOperand).name.field_2;
  pcVar1 = (leftOperand->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->leftOperand,pcVar1,pcVar1 + (leftOperand->name)._M_string_length);
  (this->rightOperand).name._M_dataplus._M_p = (pointer)&(this->rightOperand).name.field_2;
  pcVar1 = (rightOperand->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rightOperand,pcVar1,pcVar1 + (rightOperand->name)._M_string_length);
  return;
}

Assistant:

AssemblyCode::CJumpLessCommand::CJumpLessCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand,
                                                  const std::string &label ) : AbstractJumpCommand( label ),
                                                                               leftOperand( leftOperand ),
                                                                               rightOperand( rightOperand ) { }